

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O2

void empty_opendir_cb(uv_fs_t *req)

{
  void *dir;
  int iVar1;
  uv_loop_t *loop;
  char *__format;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  int64_t eval_b;
  int64_t eval_a;
  
  dir = opendir_req.ptr;
  if (req == &opendir_req) {
    eval_a = (int64_t)opendir_req.fs_type;
    eval_b = 0x1f;
    if (eval_a == 0x1f) {
      eval_a = opendir_req.result;
      eval_b = 0;
      if (opendir_req.result == 0) {
        if (opendir_req.ptr == (void *)0x0) {
          pcVar3 = "!=";
          pcVar5 = "!=";
          eval_b = 0;
          eval_a = 0;
          pcVar4 = "NULL";
          __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
          pcVar2 = "req->ptr";
          uVar6 = 0x50;
          goto LAB_00121cd7;
        }
        *(uv_dirent_t **)opendir_req.ptr = dirents;
        *(undefined8 *)((long)dir + 8) = 1;
        loop = uv_default_loop();
        iVar1 = uv_fs_readdir(loop,&readdir_req,(uv_dir_t *)dir,empty_readdir_cb);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          uv_fs_req_cleanup(&opendir_req);
          empty_opendir_cb_count = empty_opendir_cb_count + 1;
          return;
        }
        pcVar4 = "0";
        pcVar2 = "r";
        uVar6 = 0x58;
      }
      else {
        pcVar4 = "0";
        pcVar2 = "req->result";
        uVar6 = 0x4f;
      }
    }
    else {
      pcVar4 = "UV_FS_OPENDIR";
      pcVar2 = "req->fs_type";
      uVar6 = 0x4e;
    }
    pcVar3 = "==";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    pcVar5 = "==";
  }
  else {
    pcVar3 = "==";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar2 = "req";
    uVar6 = 0x4d;
    pcVar5 = "==";
    pcVar4 = "&opendir_req";
    eval_a = (int64_t)req;
    eval_b = (int64_t)&opendir_req;
  }
LAB_00121cd7:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
          ,uVar6,pcVar2,pcVar3,pcVar4,eval_a,pcVar5,eval_b);
  abort();
}

Assistant:

static void empty_opendir_cb(uv_fs_t* req) {
  uv_dir_t* dir;
  int r;

  ASSERT_PTR_EQ(req, &opendir_req);
  ASSERT_EQ(req->fs_type, UV_FS_OPENDIR);
  ASSERT_OK(req->result);
  ASSERT_NOT_NULL(req->ptr);
  dir = req->ptr;
  dir->dirents = dirents;
  dir->nentries = ARRAY_SIZE(dirents);
  r = uv_fs_readdir(uv_default_loop(),
                    &readdir_req,
                    dir,
                    empty_readdir_cb);
  ASSERT_OK(r);
  uv_fs_req_cleanup(req);
  ++empty_opendir_cb_count;
}